

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionDispatcherMt.cpp
# Opt level: O1

void __thiscall
cbtCollisionDispatcherMt::releaseManifold
          (cbtCollisionDispatcherMt *this,cbtPersistentManifold *manifold)

{
  int iVar1;
  int iVar2;
  cbtPersistentManifold **ppcVar3;
  cbtPersistentManifold *pcVar4;
  cbtPoolAllocator *this_00;
  
  (*(this->super_cbtCollisionDispatcher).super_cbtDispatcher._vptr_cbtDispatcher[5])();
  if (this->m_batchUpdating == false) {
    iVar1 = manifold->m_index1a;
    iVar2 = (this->super_cbtCollisionDispatcher).m_manifoldsPtr.m_size;
    ppcVar3 = (this->super_cbtCollisionDispatcher).m_manifoldsPtr.m_data;
    pcVar4 = ppcVar3[iVar1];
    ppcVar3[iVar1] = ppcVar3[(long)iVar2 + -1];
    (this->super_cbtCollisionDispatcher).m_manifoldsPtr.m_data[(long)iVar2 + -1] = pcVar4;
    (this->super_cbtCollisionDispatcher).m_manifoldsPtr.m_data[iVar1]->m_index1a = iVar1;
    (this->super_cbtCollisionDispatcher).m_manifoldsPtr.m_size = iVar2 + -1;
  }
  if (manifold != (cbtPersistentManifold *)0x0) {
    this_00 = (this->super_cbtCollisionDispatcher).m_persistentManifoldPoolAllocator;
    if (((cbtPersistentManifold *)this_00->m_pool <= manifold) &&
       (manifold <
        (cbtPersistentManifold *)
        ((long)((cbtPersistentManifold *)this_00->m_pool)->m_pointCache[0].reactions_cache +
        (long)this_00->m_elemSize * (long)this_00->m_maxElements + -8))) {
      cbtPoolAllocator::freeMemory(this_00,manifold);
      return;
    }
  }
  cbtAlignedFreeInternal(manifold);
  return;
}

Assistant:

void cbtCollisionDispatcherMt::releaseManifold(cbtPersistentManifold* manifold)
{
	clearManifold(manifold);
	//cbtAssert( !cbtThreadsAreRunning() );
	if (!m_batchUpdating)
	{
		// batch updater will update manifold pointers array after finishing, so
		// only need to update array when not batch-updating
		int findIndex = manifold->m_index1a;
		cbtAssert(findIndex < m_manifoldsPtr.size());
		m_manifoldsPtr.swap(findIndex, m_manifoldsPtr.size() - 1);
		m_manifoldsPtr[findIndex]->m_index1a = findIndex;
		m_manifoldsPtr.pop_back();
	}

	manifold->~cbtPersistentManifold();
	if (m_persistentManifoldPoolAllocator->validPtr(manifold))
	{
		m_persistentManifoldPoolAllocator->freeMemory(manifold);
	}
	else
	{
		cbtAlignedFree(manifold);
	}
}